

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall RoboClaw::write_n(RoboClaw *this,uint8_t byte,...)

{
  char in_AL;
  ssize_t sVar1;
  undefined8 in_RCX;
  undefined8 uVar2;
  undefined7 uVar3;
  size_t __nbytes;
  undefined8 in_RDX;
  void *__buf;
  byte in_SIL;
  RoboClaw *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint16_t crc;
  uint8_t data;
  uint8_t index;
  va_list marker;
  uint8_t trys;
  undefined4 *local_118;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  uint16_t local_3c;
  byte local_3a;
  byte local_39;
  uint local_38;
  undefined4 local_34;
  undefined4 *local_30;
  undefined1 *local_28;
  char local_12;
  byte local_11;
  RoboClaw *local_10;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_12 = '\x02';
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_11 = in_SIL;
  local_10 = in_RDI;
  while( true ) {
    crc_clear(in_RDI);
    local_28 = local_f8;
    local_30 = (undefined4 *)&stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    for (local_39 = 0; uVar2 = 0, local_39 < local_11; local_39 = local_39 + 1) {
      if (local_38 < 0x29) {
        local_118 = (undefined4 *)(local_28 + (int)local_38);
        local_38 = local_38 + 8;
      }
      else {
        local_118 = local_30;
        local_30 = local_30 + 2;
      }
      local_3a = (byte)*local_118;
      crc_update(in_RDI,local_3a);
      (**in_RDI->_vptr_RoboClaw)(in_RDI,(ulong)local_3a);
    }
    local_3c = crc_get(in_RDI);
    uVar3 = (undefined7)((ulong)uVar2 >> 8);
    (**in_RDI->_vptr_RoboClaw)(in_RDI,(ulong)(byte)(local_3c >> 8));
    __nbytes = CONCAT71(uVar3,(byte)local_3c);
    (**in_RDI->_vptr_RoboClaw)(in_RDI,(ulong)(byte)local_3c);
    sVar1 = read(in_RDI,in_RDI->m_timeout,__buf,__nbytes);
    if (((uint)sVar1 & 0xff) == 0xff) break;
    bVar4 = local_12 == '\0';
    local_12 = local_12 + -1;
    if (bVar4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool RoboClaw::write_n(uint8_t byte, ... )
{
    uint8_t trys=MAXRETRY;
    do{
        crc_clear();
        //send data with crc
        va_list marker;
        va_start( marker, byte );     /* Initialize variable arguments. */
        for( uint8_t index=0; index<byte; index++ )
        {
            uint8_t data = va_arg(marker, int);
            crc_update(data);
            write(data);
        }
        va_end( marker );              /* Reset variable arguments.      */
        uint16_t crc = crc_get();
        write(crc>>8);
        write(crc);
        if( read( m_timeout ) == 0xFF )
            return true;
    } while( trys-- );
    return false;
}